

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O1

void run_andnot_test(void)

{
  ushort uVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  array_container_t *container;
  array_container_t *container_00;
  array_container_t *container_01;
  array_container_t *container_02;
  array_container_t *container_03;
  bitset_container_t *src_2;
  bitset_container_t *src_2_00;
  bitset_container_t *src_2_01;
  bitset_container_t *src_1;
  bitset_container_t *bitset;
  run_container_t *run;
  run_container_t *run_00;
  run_container_t *run_01;
  run_container_t *run_02;
  unsigned_long uVar5;
  array_container_t *paVar6;
  run_container_t *prVar7;
  array_container_t *paVar8;
  int iVar9;
  int iVar10;
  ushort uVar11;
  int x;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int i_1;
  ulong unaff_R13;
  ulong uVar17;
  container_t *BM_1;
  array_container_t *local_40;
  run_container_t *local_38;
  
  container = array_container_create();
  container_00 = array_container_create();
  container_01 = array_container_create();
  container_02 = array_container_create();
  container_03 = array_container_create();
  src_2 = bitset_container_create();
  src_2_00 = bitset_container_create();
  src_2_01 = bitset_container_create();
  src_1 = bitset_container_create();
  bitset = bitset_container_create();
  run = run_container_create();
  run_00 = run_container_create();
  run_01 = run_container_create();
  uVar14 = 0;
  run_02 = run_container_create();
  do {
    if ((uint)((int)uVar14 + (int)(uVar14 / 5) * -5) < 3) {
      iVar4 = container->cardinality;
      uVar11 = (ushort)uVar14;
      if (((long)iVar4 == 0) ||
         ((iVar4 != 0x7fffffff && (container->array[(long)iVar4 + -1] < uVar11)))) {
        if (iVar4 == container->capacity) {
          array_container_grow(container,container->capacity + 1,true);
        }
        iVar4 = container->cardinality;
        container->cardinality = iVar4 + 1;
        container->array[iVar4] = uVar11;
      }
      else {
        iVar10 = iVar4 + -1;
        uVar12 = 0;
        uVar17 = unaff_R13;
        do {
          if (iVar10 < (int)uVar12) {
            unaff_R13 = (ulong)~uVar12;
            break;
          }
          uVar13 = uVar12 + iVar10 >> 1;
          unaff_R13 = (ulong)uVar13;
          uVar1 = *(ushort *)((long)container->array + (ulong)(uVar12 + iVar10 & 0xfffffffe));
          if (uVar1 < uVar11) {
            uVar12 = uVar13 + 1;
            bVar2 = true;
            unaff_R13 = uVar17;
          }
          else if (uVar11 < uVar1) {
            iVar10 = uVar13 - 1;
            bVar2 = true;
            unaff_R13 = uVar17;
          }
          else {
            bVar2 = false;
          }
          uVar17 = unaff_R13;
        } while (bVar2);
        if ((iVar4 != 0x7fffffff) && ((int)(uint)unaff_R13 < 0)) {
          if (iVar4 == container->capacity) {
            array_container_grow(container,container->capacity + 1,true);
          }
          uVar12 = ~(uint)unaff_R13;
          unaff_R13 = (ulong)uVar12;
          memmove(container->array + unaff_R13 + 1,container->array + unaff_R13,
                  (long)(int)(iVar4 - uVar12) * 2);
          container->array[unaff_R13] = uVar11;
          container->cardinality = container->cardinality + 1;
        }
      }
      uVar17 = src_2->words[uVar14 >> 6];
      uVar16 = uVar17 | 1L << (uVar14 & 0x3f);
      src_2->cardinality = src_2->cardinality + (int)((uVar17 ^ uVar16) >> ((byte)uVar14 & 0x3f));
      src_2->words[uVar14 >> 6] = uVar16;
      run_container_add(run,uVar11);
    }
    uVar12 = (int)uVar14 + 1;
    uVar14 = (ulong)uVar12;
  } while (uVar12 != 0x10000);
  uVar14 = 0;
  do {
    if ((uint)((int)((uVar14 >> 1) / 0x1f) * -0x3f + (int)((uVar14 >> 1) / 0x1f) + (int)uVar14) <
        0x25) {
      iVar4 = container_00->cardinality;
      uVar11 = (ushort)uVar14;
      if (((long)iVar4 == 0) ||
         ((iVar4 != 0x7fffffff && (container_00->array[(long)iVar4 + -1] < uVar11)))) {
        if (iVar4 == container_00->capacity) {
          array_container_grow(container_00,container_00->capacity + 1,true);
        }
        iVar4 = container_00->cardinality;
        container_00->cardinality = iVar4 + 1;
        container_00->array[iVar4] = uVar11;
      }
      else {
        iVar10 = iVar4 + -1;
        uVar12 = 0;
        uVar17 = unaff_R13;
        do {
          if (iVar10 < (int)uVar12) {
            unaff_R13 = (ulong)~uVar12;
            break;
          }
          uVar13 = uVar12 + iVar10 >> 1;
          unaff_R13 = (ulong)uVar13;
          uVar1 = *(ushort *)((long)container_00->array + (ulong)(uVar12 + iVar10 & 0xfffffffe));
          if (uVar1 < uVar11) {
            uVar12 = uVar13 + 1;
            bVar2 = true;
            unaff_R13 = uVar17;
          }
          else if (uVar11 < uVar1) {
            iVar10 = uVar13 - 1;
            bVar2 = true;
            unaff_R13 = uVar17;
          }
          else {
            bVar2 = false;
          }
          uVar17 = unaff_R13;
        } while (bVar2);
        if ((iVar4 != 0x7fffffff) && ((int)(uint)unaff_R13 < 0)) {
          if (iVar4 == container_00->capacity) {
            array_container_grow(container_00,container_00->capacity + 1,true);
          }
          uVar12 = ~(uint)unaff_R13;
          unaff_R13 = (ulong)uVar12;
          memmove(container_00->array + unaff_R13 + 1,container_00->array + unaff_R13,
                  (long)(int)(iVar4 - uVar12) * 2);
          container_00->array[unaff_R13] = uVar11;
          container_00->cardinality = container_00->cardinality + 1;
        }
      }
      uVar17 = src_2_00->words[uVar14 >> 6];
      uVar16 = uVar17 | 1L << (uVar14 & 0x3f);
      src_2_00->cardinality =
           src_2_00->cardinality + (int)((uVar17 ^ uVar16) >> ((byte)uVar14 & 0x3f));
      src_2_00->words[uVar14 >> 6] = uVar16;
      run_container_add(run_00,uVar11);
    }
    uVar12 = (int)uVar14 + 1;
    uVar14 = (ulong)uVar12;
  } while (uVar12 != 0x10000);
  uVar14 = 0;
  do {
    iVar4 = (int)uVar14;
    if (((uint)(iVar4 + (int)(uVar14 / 5) * -5) < 3) &&
       (0x24 < (uint)((int)((uVar14 >> 1) / 0x1f) * -0x3f + (int)((uVar14 >> 1) / 0x1f) + iVar4))) {
      iVar10 = container_03->cardinality;
      unaff_R13 = (ulong)iVar10;
      uVar11 = (ushort)uVar14;
      if ((unaff_R13 == 0) ||
         ((iVar10 != 0x7fffffff && (container_03->array[unaff_R13 - 1] < uVar11)))) {
        if (iVar10 == container_03->capacity) {
          array_container_grow(container_03,container_03->capacity + 1,true);
        }
        iVar10 = container_03->cardinality;
        container_03->cardinality = iVar10 + 1;
        container_03->array[iVar10] = uVar11;
      }
      else {
        iVar9 = iVar10 + -1;
        uVar12 = 0;
        paVar6 = container_03;
        do {
          if (iVar9 < (int)uVar12) {
            uVar13 = ~uVar12;
            break;
          }
          uVar13 = uVar12 + iVar9 >> 1;
          paVar8 = (array_container_t *)(ulong)uVar13;
          uVar1 = *(ushort *)((long)container_03->array + (ulong)(uVar12 + iVar9 & 0xfffffffe));
          if (uVar1 < uVar11) {
            uVar12 = uVar13 + 1;
            bVar2 = true;
            paVar8 = paVar6;
          }
          else if (uVar11 < uVar1) {
            iVar9 = uVar13 - 1;
            bVar2 = true;
            paVar8 = paVar6;
          }
          else {
            bVar2 = false;
          }
          uVar13 = (uint)paVar8;
          paVar6 = paVar8;
        } while (bVar2);
        if ((iVar10 != 0x7fffffff) && ((int)uVar13 < 0)) {
          if (iVar10 == container_03->capacity) {
            array_container_grow(container_03,container_03->capacity + 1,true);
          }
          uVar13 = ~uVar13;
          unaff_R13 = (ulong)(iVar10 - uVar13);
          memmove(container_03->array + (ulong)uVar13 + 1,container_03->array + uVar13,
                  (long)(int)(iVar10 - uVar13) * 2);
          container_03->array[uVar13] = uVar11;
          container_03->cardinality = container_03->cardinality + 1;
        }
      }
      uVar17 = bitset->words[uVar14 >> 6];
      uVar16 = uVar17 | 1L << (uVar14 & 0x3f);
      bitset->cardinality = bitset->cardinality + (int)((uVar17 ^ uVar16) >> ((byte)uVar14 & 0x3f));
      bitset->words[uVar14 >> 6] = uVar16;
    }
    uVar14 = (ulong)(iVar4 + 1U);
  } while (iVar4 + 1U != 0x10000);
  uVar14 = 0;
  do {
    uVar13 = (uint)uVar14;
    uVar12 = uVar13 + (int)(uVar14 / 5) * -5;
    if ((uVar12 < 2) || (10000 < uVar13 && uVar12 == 2)) {
      iVar4 = container_01->cardinality;
      uVar11 = (ushort)uVar14;
      if (((long)iVar4 == 0) ||
         ((iVar4 != 0x7fffffff && (container_01->array[(long)iVar4 + -1] < uVar11)))) {
        if (iVar4 == container_01->capacity) {
          array_container_grow(container_01,container_01->capacity + 1,true);
        }
        iVar4 = container_01->cardinality;
        container_01->cardinality = iVar4 + 1;
        container_01->array[iVar4] = uVar11;
      }
      else {
        iVar10 = iVar4 + -1;
        uVar12 = 0;
        uVar17 = unaff_R13;
        do {
          if (iVar10 < (int)uVar12) {
            unaff_R13 = (ulong)~uVar12;
            break;
          }
          uVar15 = uVar12 + iVar10 >> 1;
          unaff_R13 = (ulong)uVar15;
          uVar1 = *(ushort *)((long)container_01->array + (ulong)(uVar12 + iVar10 & 0xfffffffe));
          if (uVar1 < uVar11) {
            uVar12 = uVar15 + 1;
            bVar2 = true;
            unaff_R13 = uVar17;
          }
          else if (uVar11 < uVar1) {
            iVar10 = uVar15 - 1;
            bVar2 = true;
            unaff_R13 = uVar17;
          }
          else {
            bVar2 = false;
          }
          uVar17 = unaff_R13;
        } while (bVar2);
        if ((iVar4 != 0x7fffffff) && ((int)(uint)unaff_R13 < 0)) {
          if (iVar4 == container_01->capacity) {
            array_container_grow(container_01,container_01->capacity + 1,true);
          }
          uVar12 = ~(uint)unaff_R13;
          unaff_R13 = (ulong)uVar12;
          memmove(container_01->array + unaff_R13 + 1,container_01->array + unaff_R13,
                  (long)(int)(iVar4 - uVar12) * 2);
          container_01->array[unaff_R13] = uVar11;
          container_01->cardinality = container_01->cardinality + 1;
        }
      }
      uVar17 = src_2_01->words[uVar14 >> 6];
      uVar16 = uVar17 | 1L << (uVar14 & 0x3f);
      src_2_01->cardinality =
           src_2_01->cardinality + (int)((uVar17 ^ uVar16) >> ((byte)uVar14 & 0x3f));
      src_2_01->words[uVar14 >> 6] = uVar16;
      run_container_add(run_01,uVar11);
    }
    uVar14 = (ulong)(uVar13 + 1);
  } while (uVar13 + 1 != 0x10000);
  uVar14 = 0;
  uVar12 = 1;
  do {
    if ((uVar12 & 3) != 0) {
      uVar11 = (ushort)uVar14;
      run_container_add(run_02,uVar11);
      iVar4 = container_02->cardinality;
      if (((long)iVar4 == 0) ||
         ((iVar4 != 0x7fffffff && (container_02->array[(long)iVar4 + -1] < uVar11)))) {
        if (iVar4 == container_02->capacity) {
          array_container_grow(container_02,container_02->capacity + 1,true);
        }
        iVar4 = container_02->cardinality;
        container_02->cardinality = iVar4 + 1;
        container_02->array[iVar4] = uVar11;
      }
      else {
        iVar10 = iVar4 + -1;
        uVar13 = 0;
        paVar6 = container_03;
        do {
          if (iVar10 < (int)uVar13) {
            uVar15 = ~uVar13;
            break;
          }
          uVar15 = uVar13 + iVar10 >> 1;
          paVar8 = (array_container_t *)(ulong)uVar15;
          uVar1 = *(ushort *)((long)container_02->array + (ulong)(uVar13 + iVar10 & 0xfffffffe));
          if (uVar1 < uVar11) {
            uVar13 = uVar15 + 1;
            bVar2 = true;
            paVar8 = paVar6;
          }
          else if (uVar11 < uVar1) {
            iVar10 = uVar15 - 1;
            bVar2 = true;
            paVar8 = paVar6;
          }
          else {
            bVar2 = false;
          }
          uVar15 = (uint)paVar8;
          paVar6 = paVar8;
        } while (bVar2);
        if ((iVar4 != 0x7fffffff) && ((int)uVar15 < 0)) {
          if (iVar4 == container_02->capacity) {
            array_container_grow(container_02,container_02->capacity + 1,true);
          }
          uVar15 = ~uVar15;
          memmove(container_02->array + (ulong)uVar15 + 1,container_02->array + uVar15,
                  (long)(int)(iVar4 - uVar15) * 2);
          container_02->array[uVar15] = uVar11;
          container_02->cardinality = container_02->cardinality + 1;
        }
      }
      uVar17 = src_1->words[uVar14 >> 6];
      uVar16 = uVar17 | 1L << (uVar14 & 0x3f);
      src_1->cardinality = src_1->cardinality + (int)((uVar17 ^ uVar16) >> ((byte)uVar14 & 0x3f));
      src_1->words[uVar14 >> 6] = uVar16;
    }
    uVar12 = (uVar12 * 0xd68 + 0x1a85) % 0x26f5;
    uVar13 = (int)uVar14 + 1;
    uVar14 = (ulong)uVar13;
  } while (uVar13 != 0x10000);
  uVar5 = (unsigned_long)container_03->cardinality;
  local_40 = (array_container_t *)0x0;
  _Var3 = run_bitset_container_andnot(run,src_2,&local_40);
  _assert_true((ulong)!_Var3,"run_bitset_container_andnot(R1, B1, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x2dd);
  _assert_int_equal(0,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2de);
  array_container_free(local_40);
  local_40 = (array_container_t *)0x0;
  array_run_container_andnot(container,run,container_03);
  _assert_int_equal(0,(long)container_03->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2e3);
  iVar4 = run_run_container_andnot(run,run,&local_40);
  _assert_int_equal(3,(long)iVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2e8);
  iVar4 = run_container_cardinality((run_container_t *)local_40);
  _assert_int_equal(0,(long)iVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2e9);
  run_container_free((run_container_t *)local_40);
  local_40 = (array_container_t *)0x0;
  _Var3 = run_bitset_container_andnot(run,src_2_01,&local_40);
  _assert_true((ulong)!_Var3,"run_bitset_container_andnot(R1, B3, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x2ed);
  _assert_int_equal(2000,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2ee);
  array_container_free(local_40);
  local_40 = (array_container_t *)0x0;
  _Var3 = bitset_run_container_andnot(src_2,run_01,&local_40);
  _assert_true((ulong)!_Var3,"bitset_run_container_andnot(B1, R3, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x2f2);
  _assert_int_equal(2000,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2f3);
  array_container_free(local_40);
  local_40 = (array_container_t *)0x0;
  array_run_container_andnot(container,run_01,container_03);
  _assert_int_equal(2000,(long)container_03->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2f8);
  iVar4 = run_array_container_andnot(run,container_01,&local_40);
  _assert_int_equal(2,(long)iVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2fb);
  _assert_int_equal(2000,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2fc);
  array_container_free(local_40);
  local_40 = (array_container_t *)0x0;
  iVar4 = run_run_container_andnot(run,run_01,&local_40);
  _assert_int_equal(2,(long)iVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x301);
  _assert_int_equal(2000,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x302);
  array_container_free(local_40);
  local_40 = (array_container_t *)0x0;
  uVar14 = 0;
  _Var3 = run_bitset_container_andnot(run,src_2_00,&local_40);
  _assert_true((ulong)_Var3,"run_bitset_container_andnot(R1, B2, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x306);
  _assert_int_equal(uVar5,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x307);
  bitset_container_free((bitset_container_t *)local_40);
  local_40 = (array_container_t *)0x0;
  array_run_container_andnot(container,run_00,container_03);
  _assert_int_equal(uVar5,(long)container_03->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x30c);
  iVar4 = 0x3de;
  paVar6 = array_container_create();
  do {
    iVar10 = paVar6->cardinality;
    uVar11 = (ushort)iVar4;
    if (((long)iVar10 == 0) ||
       ((iVar10 != 0x7fffffff && (paVar6->array[(long)iVar10 + -1] < uVar11)))) {
      if (iVar10 == paVar6->capacity) {
        array_container_grow(paVar6,paVar6->capacity + 1,true);
      }
      iVar10 = paVar6->cardinality;
      paVar6->cardinality = iVar10 + 1;
      paVar6->array[iVar10] = uVar11;
    }
    else {
      iVar9 = iVar10 + -1;
      uVar12 = 0;
      do {
        if (iVar9 < (int)uVar12) {
          uVar14 = (ulong)~uVar12;
          break;
        }
        uVar13 = uVar12 + iVar9 >> 1;
        uVar1 = *(ushort *)((long)paVar6->array + (ulong)(uVar12 + iVar9 & 0xfffffffe));
        if (uVar1 < uVar11) {
          uVar12 = uVar13 + 1;
          bVar2 = true;
        }
        else if (uVar11 < uVar1) {
          iVar9 = uVar13 - 1;
          bVar2 = true;
        }
        else {
          bVar2 = false;
          uVar14 = (ulong)uVar13;
        }
      } while (bVar2);
      if ((iVar10 != 0x7fffffff) && ((int)(uint)uVar14 < 0)) {
        if (iVar10 == paVar6->capacity) {
          array_container_grow(paVar6,paVar6->capacity + 1,true);
        }
        uVar12 = ~(uint)uVar14;
        uVar14 = (ulong)uVar12;
        memmove(paVar6->array + uVar14 + 1,paVar6->array + uVar14,(long)(int)(iVar10 - uVar12) * 2);
        paVar6->array[uVar14] = uVar11;
        paVar6->cardinality = paVar6->cardinality + 1;
      }
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 1000);
  iVar4 = -10;
  prVar7 = run_container_create();
  do {
    run_container_add(prVar7,(short)iVar4 + 1000);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0);
  array_run_container_andnot(paVar6,run_00,container_03);
  _assert_int_equal(2,(long)container_03->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x316);
  _Var3 = run_bitset_container_andnot(prVar7,src_2_00,&local_40);
  _assert_true((ulong)!_Var3,"run_bitset_container_andnot(R_small, B2, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x318);
  _assert_int_equal(2,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x319);
  array_container_free(local_40);
  uVar14 = 0;
  local_40 = (array_container_t *)0x0;
  local_38 = prVar7;
  iVar4 = run_array_container_andnot(prVar7,container_00,&local_40);
  _assert_int_equal(3,(long)iVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,799);
  iVar4 = run_container_cardinality((run_container_t *)local_40);
  _assert_int_equal(2,(long)iVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,800);
  run_container_free((run_container_t *)local_40);
  local_40 = (array_container_t *)0x0;
  prVar7 = run_container_create();
  paVar8 = array_container_create();
  do {
    run_container_add(prVar7,(uint16_t)uVar14);
    uVar12 = (int)uVar14 + 1;
    uVar14 = (ulong)uVar12;
  } while (uVar12 != 3);
  iVar4 = -2;
  do {
    run_container_add(prVar7,(short)iVar4 + 0xc);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0);
  iVar4 = -5;
  do {
    run_container_add(prVar7,(short)iVar4 + 0x3e3);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0);
  iVar4 = -3;
  do {
    run_container_add(prVar7,(short)iVar4 + 0x2713);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0);
  iVar4 = -2;
  do {
    run_container_add(prVar7,(short)iVar4 + 0x4e22);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0);
  iVar4 = paVar8->cardinality;
  if (((long)iVar4 == 0) || ((iVar4 != 0x7fffffff && (paVar8->array[(long)iVar4 + -1] < 0x3e1)))) {
    if (iVar4 == paVar8->capacity) {
      array_container_grow(paVar8,paVar8->capacity + 1,true);
    }
    iVar4 = paVar8->cardinality;
    paVar8->cardinality = iVar4 + 1;
    paVar8->array[iVar4] = 0x3e1;
  }
  else {
    iVar10 = iVar4 + -1;
    uVar12 = 0;
    do {
      if (iVar10 < (int)uVar12) {
        uVar14 = (ulong)~uVar12;
        break;
      }
      uVar13 = uVar12 + iVar10 >> 1;
      uVar11 = *(ushort *)((long)paVar8->array + (ulong)(uVar12 + iVar10 & 0xfffffffe));
      if (uVar11 < 0x3e1) {
        uVar12 = uVar13 + 1;
        bVar2 = true;
      }
      else if (uVar11 == 0x3e1) {
        bVar2 = false;
        uVar14 = (ulong)uVar13;
      }
      else {
        iVar10 = uVar13 - 1;
        bVar2 = true;
      }
    } while (bVar2);
    if ((iVar4 != 0x7fffffff) && ((int)(uint)uVar14 < 0)) {
      if (iVar4 == paVar8->capacity) {
        array_container_grow(paVar8,paVar8->capacity + 1,true);
      }
      uVar12 = ~(uint)uVar14;
      uVar14 = (ulong)uVar12;
      memmove(paVar8->array + uVar14 + 1,paVar8->array + uVar14,(long)(int)(iVar4 - uVar12) * 2);
      paVar8->array[uVar14] = 0x3e1;
      paVar8->cardinality = paVar8->cardinality + 1;
    }
  }
  iVar4 = paVar8->cardinality;
  if (((long)iVar4 == 0) || ((iVar4 != 0x7fffffff && (paVar8->array[(long)iVar4 + -1] < 0x3e2)))) {
    if (iVar4 == paVar8->capacity) {
      array_container_grow(paVar8,paVar8->capacity + 1,true);
    }
    iVar4 = paVar8->cardinality;
    paVar8->cardinality = iVar4 + 1;
    paVar8->array[iVar4] = 0x3e2;
  }
  else {
    iVar10 = iVar4 + -1;
    uVar12 = 0;
    do {
      if (iVar10 < (int)uVar12) {
        uVar14 = (ulong)~uVar12;
        break;
      }
      uVar13 = uVar12 + iVar10 >> 1;
      uVar11 = *(ushort *)((long)paVar8->array + (ulong)(uVar12 + iVar10 & 0xfffffffe));
      if (uVar11 < 0x3e2) {
        uVar12 = uVar13 + 1;
        bVar2 = true;
      }
      else if (uVar11 == 0x3e2) {
        bVar2 = false;
        uVar14 = (ulong)uVar13;
      }
      else {
        iVar10 = uVar13 - 1;
        bVar2 = true;
      }
    } while (bVar2);
    if ((iVar4 != 0x7fffffff) && ((int)(uint)uVar14 < 0)) {
      if (iVar4 == paVar8->capacity) {
        array_container_grow(paVar8,paVar8->capacity + 1,true);
      }
      uVar12 = ~(uint)uVar14;
      uVar14 = (ulong)uVar12;
      memmove(paVar8->array + uVar14 + 1,paVar8->array + uVar14,(long)(int)(iVar4 - uVar12) * 2);
      paVar8->array[uVar14] = 0x3e2;
      paVar8->cardinality = paVar8->cardinality + 1;
    }
  }
  iVar4 = paVar8->cardinality;
  if (((long)iVar4 == 0) || ((iVar4 != 0x7fffffff && (paVar8->array[(long)iVar4 + -1] < 2000)))) {
    if (iVar4 == paVar8->capacity) {
      array_container_grow(paVar8,paVar8->capacity + 1,true);
    }
    iVar4 = paVar8->cardinality;
    paVar8->cardinality = iVar4 + 1;
    paVar8->array[iVar4] = 2000;
  }
  else {
    iVar10 = iVar4 + -1;
    uVar12 = 0;
    do {
      if (iVar10 < (int)uVar12) {
        uVar13 = ~uVar12;
        break;
      }
      uVar13 = uVar12 + iVar10 >> 1;
      uVar11 = *(ushort *)((long)paVar8->array + (ulong)(uVar12 + iVar10 & 0xfffffffe));
      if (uVar11 < 2000) {
        uVar12 = uVar13 + 1;
        bVar2 = true;
      }
      else if (uVar11 == 2000) {
        bVar2 = false;
        uVar14 = (ulong)uVar13;
      }
      else {
        iVar10 = uVar13 - 1;
        bVar2 = true;
      }
      uVar13 = (uint)uVar14;
    } while (bVar2);
    if ((iVar4 != 0x7fffffff) && ((int)uVar13 < 0)) {
      if (iVar4 == paVar8->capacity) {
        array_container_grow(paVar8,paVar8->capacity + 1,true);
      }
      uVar13 = ~uVar13;
      memmove(paVar8->array + (ulong)uVar13 + 1,paVar8->array + uVar13,
              (long)(int)(iVar4 - uVar13) * 2);
      paVar8->array[uVar13] = 2000;
      paVar8->cardinality = paVar8->cardinality + 1;
    }
  }
  iVar4 = run_array_container_andnot(prVar7,paVar8,&local_40);
  _assert_int_equal(3,(long)iVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x333);
  iVar4 = run_container_cardinality((run_container_t *)local_40);
  _assert_int_equal(0xd,(long)iVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x334);
  array_container_free(local_40);
  local_40 = (array_container_t *)0x0;
  array_container_free(paVar8);
  run_container_free(prVar7);
  iVar4 = run_array_container_andnot(run,container_01,&local_40);
  _assert_int_equal(2,(long)iVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x33c);
  _assert_int_equal(2000,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x33d);
  array_container_free(local_40);
  local_40 = (array_container_t *)0x0;
  iVar4 = run_run_container_andnot(run,run_00,&local_40);
  _assert_int_equal(1,(long)iVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x342);
  _assert_int_equal(uVar5,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x343);
  bitset_container_free((bitset_container_t *)local_40);
  local_40 = (array_container_t *)0x0;
  _Var3 = bitset_bitset_container_andnot(src_1,src_2_01,&local_40);
  _assert_true((ulong)_Var3,"bitset_bitset_container_andnot(B4, B3, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x349);
  uVar5 = (unsigned_long)local_40->cardinality;
  bitset_container_free((bitset_container_t *)local_40);
  local_40 = (array_container_t *)0x0;
  _Var3 = run_bitset_container_andnot(run_02,src_2_01,&local_40);
  _assert_true((ulong)_Var3,"run_bitset_container_andnot(R4, B3, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x34e);
  _assert_int_equal(uVar5,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x34f);
  bitset_container_free((bitset_container_t *)local_40);
  local_40 = (array_container_t *)0x0;
  array_run_container_andnot(container_02,run_01,container_03);
  _assert_int_equal(uVar5,(long)container_03->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x355);
  iVar4 = run_run_container_andnot(run_02,run_01,&local_40);
  _assert_int_equal(1,(long)iVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x358);
  _assert_int_equal(uVar5,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x359);
  bitset_container_free((bitset_container_t *)local_40);
  local_40 = (array_container_t *)0x0;
  array_container_free(container);
  array_container_free(container_00);
  array_container_free(container_01);
  array_container_free(container_02);
  array_container_free(container_03);
  array_container_free(paVar6);
  bitset_container_free(src_2);
  bitset_container_free(src_2_00);
  bitset_container_free(src_2_01);
  bitset_container_free(src_1);
  bitset_container_free(bitset);
  run_container_free(run);
  run_container_free(run_00);
  run_container_free(run_01);
  run_container_free(run_02);
  run_container_free(local_38);
  return;
}

Assistant:

DEFINE_TEST(run_andnot_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* A3 = array_container_create();
    array_container_t* A4 = array_container_create();
    array_container_t* AM = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* B3 = bitset_container_create();
    bitset_container_t* B4 = bitset_container_create();
    bitset_container_t* BM = bitset_container_create();
    run_container_t* R1 = run_container_create();
    run_container_t* R2 = run_container_create();
    run_container_t* R3 = run_container_create();
    run_container_t* R4 = run_container_create();

    // B/A1 minus  R1 is empty (array or run, I guess)
    // B/A1 minus R2 is probably best left as runs
    // B/A3 minus R1 is best as an array.
    // B/A3 minus R4 is best as a bitmap

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x++) {
        if (x % 5 < 3) {
            array_container_add(A1, x);
            bitset_container_set(B1, x);
            run_container_add(R1, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 62 < 37) {
            array_container_add(A2, x);
            bitset_container_set(B2, x);
            run_container_add(R2, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 5 < 3) && !(x % 62 < 37)) {
            array_container_add(AM, x);
            bitset_container_set(BM, x);
        }

    // the elements x%5 == 2 differ for less than 10k, otherwise same)
    for (int x = 0; x < (1 << 16); x++) {
        if ((x % 5 < 2) || ((x % 5 < 3) && (x > 10000))) {
            array_container_add(A3, x);
            bitset_container_set(B3, x);
            run_container_add(R3, x);
        }
    }

    int randstate = 1;  // for Oakenfull RNG, hope LSBits are nice
    for (int x = 0; x < (1 << 16); x++) {
        if (randstate % 4) {
            run_container_add(R4, x);
            array_container_add(A4, x);
            bitset_container_add(B4, x);
        }
        randstate = (3432 * randstate + 6789) % 9973;
    }

    int cm12 = array_container_cardinality(AM);

    container_t* BM_1 = NULL;

    assert_false(run_bitset_container_andnot(R1, B1, &BM_1));
    assert_int_equal(0, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A1, R1, AM);
    assert_int_equal(0, array_container_cardinality(AM));

    // both run coding and array coding have same serialized size for
    // empty
    assert_int_equal(RUN_CONTAINER_TYPE,
                     run_run_container_andnot(R1, R1, &BM_1));
    assert_int_equal(0, run_container_cardinality(CAST_run(BM_1)));
    run_container_free(CAST_run(BM_1));
    BM_1 = NULL;

    assert_false(run_bitset_container_andnot(R1, B3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_false(bitset_run_container_andnot(B1, R3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A1, R3, AM);
    assert_int_equal(2000, array_container_cardinality(AM));

    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_andnot(R1, A3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_run_container_andnot(R1, R3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_true(run_bitset_container_andnot(R1, B2, &BM_1));
    assert_int_equal(cm12, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A1, R2, AM);
    assert_int_equal(cm12, array_container_cardinality(AM));

    array_container_t* A_small = array_container_create();
    for (int i = 990; i < 1000; ++i) array_container_add(A_small, i);

    run_container_t* R_small = run_container_create();
    for (int i = 990; i < 1000; ++i) run_container_add(R_small, i);

    array_run_container_andnot(A_small, R2, AM);
    assert_int_equal(2,                                 // something like that
                     array_container_cardinality(AM));  // hopefully right...

    assert_false(run_bitset_container_andnot(R_small, B2, &BM_1));
    assert_int_equal(2, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    // note, result is equally small as an array or a run
    assert_int_equal(RUN_CONTAINER_TYPE,
                     run_array_container_andnot(R_small, A2, &BM_1));
    assert_int_equal(2, run_container_cardinality(CAST_run(BM_1)));
    run_container_free(CAST_run(BM_1));
    BM_1 = NULL;

    // test with more complicated small run structure (to do)
    run_container_t* R_small_complex = run_container_create();
    array_container_t* temp_ac = array_container_create();

    for (int i = 0; i < 3; ++i) run_container_add(R_small_complex, i);
    for (int i = 10; i < 12; ++i) run_container_add(R_small_complex, i);
    for (int i = 990; i < 995; ++i) run_container_add(R_small_complex, i);
    for (int i = 10000; i < 10003; ++i) run_container_add(R_small_complex, i);
    for (int i = 20000; i < 20002; ++i) run_container_add(R_small_complex, i);

    array_container_add(temp_ac, 993);
    array_container_add(temp_ac, 994);
    array_container_add(temp_ac, 2000);

    assert_int_equal(RUN_CONTAINER_TYPE, run_array_container_andnot(
                                             R_small_complex, temp_ac, &BM_1));
    assert_int_equal(13, run_container_cardinality(CAST_run(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    array_container_free(temp_ac);
    run_container_free(R_small_complex);

    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_andnot(R1, A3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_andnot(R1, R2, &BM_1));
    assert_int_equal(cm12, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    // compute the true card for cont4 - cont3 assuming that
    // bitset-bitset implementation is known correct
    assert_true(bitset_bitset_container_andnot(B4, B3, &BM_1));
    int card_4_3 = bitset_container_cardinality(CAST_bitset(BM_1));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    assert_true(run_bitset_container_andnot(R4, B3, &BM_1));
    assert_int_equal(card_4_3, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A4, R3, AM);
    // if this fails, either this bitset is wrong or the previous one...
    assert_int_equal(card_4_3, array_container_cardinality(AM));

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_andnot(R4, R3, &BM_1));
    assert_int_equal(card_4_3, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    array_container_free(A1);
    array_container_free(A2);
    array_container_free(A3);
    array_container_free(A4);
    array_container_free(AM);
    array_container_free(A_small);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(B3);
    bitset_container_free(B4);
    bitset_container_free(BM);

    run_container_free(R1);
    run_container_free(R2);
    run_container_free(R3);
    run_container_free(R4);
    run_container_free(R_small);
}